

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ParseVariantSetFields
          (Impl *this,FieldValuePairVector *fvs,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren)

{
  pointer ppVar1;
  bool bVar2;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__x;
  ostream *poVar3;
  pointer __lhs;
  ostringstream ss_e;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  __lhs = (fvs->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__lhs == ppVar1) {
LAB_00158847:
      return __lhs == ppVar1;
    }
    bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"variantChildren");
    if (bVar2) {
      __x = crate::CrateValue::as<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      (&__lhs->second);
      if (__x == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,"[USDC]");
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseVariantSetFields");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x904);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_1a8,
                                   "`variantChildren` must be type `token[]`, but got type `");
        linb::any::type_name_abi_cxx11_(&local_1c8,(any *)&__lhs->second);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_1c8);
        poVar3 = ::std::operator<<(poVar3,"`");
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_1c8);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        goto LAB_00158847;
      }
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)variantChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)__x);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar3 = ::std::operator<<((ostream *)local_1a8,"[warn]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseVariantSetFields");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x908);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_1a8,"VariantSet field TODO: ");
      poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::stringbuf::str();
      PushWarn(this,&local_1c8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

bool USDCReader::Impl::ParseVariantSetFields(
    const crate::FieldValuePairVector &fvs,
    std::vector<value::token> &variantChildren) {
  // Fields for Prim and Prim metas.
  for (const auto &fv : fvs) {
    if (fv.first == "variantChildren") {
      if (auto pv = fv.second.as<std::vector<value::token>>()) {
        variantChildren = (*pv);
        DCOUT("variantChildren: " << variantChildren);
      } else {
        PUSH_ERROR_AND_RETURN_TAG(
            kTag, "`variantChildren` must be type `token[]`, but got type `"
                      << fv.second.type_name() << "`");
      }
    } else {
      DCOUT("VariantSet field TODO: " << fv.first);
      PUSH_WARN("VariantSet field TODO: " << fv.first);
    }
  }

  return true;
}